

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O1

void __thiscall Map::calcBall(Map *this,int n)

{
  char cVar1;
  int iVar2;
  int iVar3;
  Ball *pBVar4;
  Palette *pPVar5;
  long lVar6;
  uint y;
  uint x;
  float fVar7;
  float fVar8;
  double dVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  if (0x1d < (uint)n) goto LAB_00104548;
  if (this->ball[(uint)n] == (Ball *)0x0) goto LAB_00104548;
  dVar9 = cos((double)this->ball[(uint)n]->angle * 3.14);
  fVar7 = (float)((double)this->ball[(uint)n]->speed * dVar9);
  dVar9 = sin((double)this->ball[(uint)n]->angle * 3.14);
  pBVar4 = this->ball[(uint)n];
  fVar12 = (float)(dVar9 * (double)pBVar4->speed);
  fVar8 = pBVar4->x + fVar7;
  pBVar4->x = fVar8;
  fVar10 = pBVar4->y + fVar12;
  pBVar4->y = fVar10;
  if ((fVar8 <= 0.0) || ((float)this->fieldWidth <= fVar8)) {
    fVar10 = pBVar4->angle;
    if (fVar10 <= 0.0) {
      if (fVar10 < 0.0) {
        fVar11 = -1.0;
        goto LAB_00104255;
      }
      fVar11 = -fVar10;
    }
    else {
      fVar11 = 1.0;
LAB_00104255:
      fVar11 = fVar11 - fVar10;
    }
    pBVar4->angle = fVar11;
    pBVar4->x = fVar8 - fVar7;
LAB_00104273:
    pBVar4->speed = (float)((double)pBVar4->speed + 0.01);
  }
  else if (fVar10 <= 0.0) {
    pBVar4->angle = -pBVar4->angle;
    pBVar4->y = fVar10 - fVar12;
    goto LAB_00104273;
  }
  iVar2 = this->fieldBreakpoint;
  if (((float)iVar2 <= pBVar4->y) &&
     (pPVar5 = this->palette, pBVar4->y <= (float)(pPVar5->h + iVar2))) {
    fVar10 = (float)pPVar5->pos;
    fVar8 = pBVar4->x;
    if ((fVar10 <= fVar8) && (iVar3 = pPVar5->w, fVar8 <= (float)(pPVar5->pos + iVar3))) {
      if (this->stickyPalette == true) {
        lVar6 = 0;
        do {
          if (pPVar5->dockedBalls[lVar6] == (Ball *)0x0) {
            pBVar4->angle = ((fVar8 - fVar10) / (float)iVar3) * 0.7 + -0.9;
            pBVar4->y = 392.0;
            pBVar4->speed = 0.0;
            pPVar5->dockedBalls[lVar6] = pBVar4;
            break;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 != 0x1e);
      }
      else {
        pBVar4->y = (float)(iVar2 + -8);
        pBVar4->angle = ((fVar8 - fVar10) / (float)iVar3) * 0.7 + -0.9;
      }
    }
  }
  fVar8 = this->ball[(uint)n]->x;
  x = (uint)(fVar8 / 24.0);
  fVar10 = this->ball[(uint)n]->y;
  y = (uint)(fVar10 * 0.0625);
  if (y < 0x10 && x < 0x18) {
    cVar1 = this->block[x][y]->type;
    if (cVar1 != '\x18') {
      if (cVar1 == 'O') goto LAB_00104521;
      deleteBlock(this,x,y);
    }
    if (x == (int)((fVar8 - fVar7) / 24.0)) {
      pBVar4 = this->ball[(uint)n];
      pBVar4->angle = -pBVar4->angle;
      pBVar4->x = pBVar4->x - fVar7;
      if (pBVar4->speed < 1.2) {
        pBVar4->speed = pBVar4->speed + 0.01;
      }
    }
    if (y == (int)((fVar10 - fVar12) * 0.0625)) {
      pBVar4 = this->ball[(uint)n];
      fVar7 = pBVar4->angle;
      if (fVar7 <= 0.0) {
        if (fVar7 < 0.0) {
          fVar8 = -1.0;
          goto LAB_001044d7;
        }
        fVar8 = -fVar7;
      }
      else {
        fVar8 = 1.0;
LAB_001044d7:
        fVar8 = fVar8 - fVar7;
      }
      pBVar4->angle = fVar8;
      pBVar4->y = pBVar4->y - fVar12;
      if (pBVar4->speed < 1.2) {
        pBVar4->speed = pBVar4->speed + 0.01;
      }
    }
  }
LAB_00104521:
  if ((float)this->fieldHeight < this->ball[(uint)n]->y) {
    removeBall(this,n);
  }
LAB_00104548:
  if (this->balls < 1) {
    this->lose = true;
    this->lives = this->lives + -1;
  }
  else if (this->blockAmount < 1) {
    this->lose = true;
  }
  return;
}

Assistant:

void Map::calcBall(int n){
    if(n>=0 && n<MAX_BALLS && ball[n]){
        float dx = cos(ball[n]->angle*PI)*ball[n]->speed;
        float dy = sin(ball[n]->angle*PI)*ball[n]->speed;
        ball[n]->x += dx;
        ball[n]->y += dy;
        // Border collision
            if(ball[n]->x<=0 || ball[n]->x>=fieldWidth){
                ball[n]->angle = shiftAngleV(ball[n]->angle);
                ball[n]->x -= dx;
                if(ACCELERATE_ON_BOUNCE)
                    ball[n]->speed += ACCELERATE_ON_BOUNCE;
            } else if(ball[n]->y<=0){
                ball[n]->angle = shiftAngleH(ball[n]->angle);
                ball[n]->y -= dy;
                if(ACCELERATE_ON_BOUNCE)
                    ball[n]->speed += ACCELERATE_ON_BOUNCE;
            }
        // Palette collision
            if(ball[n]->y >= fieldBreakpoint && ball[n]->y <= fieldBreakpoint + palette->h
                    && ball[n]->x >= palette->pos && ball[n]->x <= palette->pos + palette->w){
                if(stickyPalette){
                    for(int i=0; i<MAX_BALLS; i++){
                        if(!palette->dockedBalls[i]){
                            float palx = ball[n]->x - palette->pos;
                            ball[n]->angle = -0.9 + (palx / palette->w) * 0.7;
                            ball[n]->y = PALETTE_ROW*BLOCK_H - BALL_H;
                            ball[n]->speed = 0;
                            palette->dockedBalls[i] = ball[n];
                            break;
                        }
                    }

                } else{
                    ball[n]->y = fieldBreakpoint - BALL_H;
                    float palx = ball[n]->x - palette->pos;
                    ball[n]->angle = -0.9 + (palx / palette->w) * 0.7;
                }
            }
        // Nearby block collision
            int bx = ball[n]->x / BLOCK_W;
            int by = ball[n]->y / BLOCK_H;
            int px = (ball[n]->x-dx) / BLOCK_W;
            int py = (ball[n]->y-dy) / BLOCK_H;
            if(bx >= 0 && bx < BLOCKS_W && by >= 0 && by < BLOCKS_H) {
                if(block[bx][by]->type != EMPTY_BLOCK_ID){
                    if(block[bx][by]->type != BLOCK_BLOCKY_ID) deleteBlock(bx, by);
                    if(bx == px){
                        ball[n]->angle = shiftAngleH(ball[n]->angle);
                        ball[n]->x -= dx;
                        if(ACCELERATE_ON_BOUNCE && ball[n]->speed < BALL_MAX_SPEED)
                            ball[n]->speed += ACCELERATE_ON_BOUNCE;
                    }
                    if(by == py){
                        ball[n]->angle = shiftAngleV(ball[n]->angle);
                        ball[n]->y -= dy;
                        if(ACCELERATE_ON_BOUNCE && ball[n]->speed < BALL_MAX_SPEED)
                            ball[n]->speed += ACCELERATE_ON_BOUNCE;
                    }

                }

            }

        // Fly through breakpoint
            if(ball[n]->y > fieldHeight){
                //ball[n]->angle = shiftAngleH(ball[n]->angle);
                removeBall(n);
            }
    }
    if(balls<=0) {
        lose = true;
        lives--;
    } else if(blockAmount <= 0){
        lose = true;
    }
}